

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O1

void __thiscall ON_HermiteSurface::Destroy(ON_HermiteSurface *this)

{
  long lVar1;
  long lVar2;
  
  ON_SimpleArray<double>::SetCapacity(&this->m_u_parameters,0);
  ON_SimpleArray<double>::SetCapacity(&this->m_v_parameters,0);
  if (0 < (this->m_grid_points).m_count) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      ON_SimpleArray<ON_3dPoint>::SetCapacity
                ((ON_SimpleArray<ON_3dPoint> *)
                 ((long)&((this->m_grid_points).m_a)->_vptr_ON_SimpleArray + lVar1),0);
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x18;
    } while (lVar2 < (this->m_grid_points).m_count);
  }
  ON_ClassArray<ON_SimpleArray<ON_3dPoint>_>::SetCapacity(&this->m_grid_points,0);
  if (0 < (this->m_u_tangents).m_count) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      ON_SimpleArray<ON_3dVector>::SetCapacity
                ((ON_SimpleArray<ON_3dVector> *)
                 ((long)&((this->m_u_tangents).m_a)->_vptr_ON_SimpleArray + lVar1),0);
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x18;
    } while (lVar2 < (this->m_u_tangents).m_count);
  }
  ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::SetCapacity(&this->m_u_tangents,0);
  if (0 < (this->m_v_tangents).m_count) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      ON_SimpleArray<ON_3dVector>::SetCapacity
                ((ON_SimpleArray<ON_3dVector> *)
                 ((long)&((this->m_v_tangents).m_a)->_vptr_ON_SimpleArray + lVar1),0);
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x18;
    } while (lVar2 < (this->m_v_tangents).m_count);
  }
  ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::SetCapacity(&this->m_v_tangents,0);
  if (0 < (this->m_twists).m_count) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      ON_SimpleArray<ON_3dVector>::SetCapacity
                ((ON_SimpleArray<ON_3dVector> *)
                 ((long)&((this->m_twists).m_a)->_vptr_ON_SimpleArray + lVar1),0);
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x18;
    } while (lVar2 < (this->m_twists).m_count);
  }
  ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::SetCapacity(&this->m_twists,0);
  return;
}

Assistant:

void ON_HermiteSurface::Destroy()
{
  m_u_parameters.Destroy();
  m_v_parameters.Destroy();

  for (int i = 0; i < m_grid_points.Count(); i++)
    m_grid_points[i].Destroy();
  m_grid_points.Destroy();

  for (int i = 0; i < m_u_tangents.Count(); i++)
    m_u_tangents[i].Destroy();
  m_u_tangents.Destroy();

  for (int i = 0; i < m_v_tangents.Count(); i++)
    m_v_tangents[i].Destroy();
  m_v_tangents.Destroy();

  for (int i = 0; i < m_twists.Count(); i++)
    m_twists[i].Destroy();
  m_twists.Destroy();
}